

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaHash.c
# Opt level: O0

Gia_Obj_t * Gia_ManAddStrash(Gia_Man_t *p,Gia_Obj_t *p0,Gia_Obj_t *p1)

{
  int iVar1;
  Gia_Obj_t *pGVar2;
  Gia_Obj_t *pObj;
  Gia_Obj_t *local_78;
  Gia_Obj_t *local_70;
  Gia_Obj_t *local_68;
  Gia_Obj_t *local_60;
  Gia_Obj_t *pFanD;
  Gia_Obj_t *pFanC;
  Gia_Obj_t *pFanB;
  Gia_Obj_t *pFanA;
  Gia_Obj_t *pNode1;
  Gia_Obj_t *pNode0;
  Gia_Obj_t *p1_local;
  Gia_Obj_t *p0_local;
  Gia_Man_t *p_local;
  
  if (p->fAddStrash == 0) {
    __assert_fail("p->fAddStrash",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaHash.c"
                  ,0x159,"Gia_Obj_t *Gia_ManAddStrash(Gia_Man_t *, Gia_Obj_t *, Gia_Obj_t *)");
  }
  pGVar2 = Gia_Regular(p0);
  pObj = Gia_Regular(p1);
  iVar1 = Gia_ObjIsAnd(pGVar2);
  if ((iVar1 == 0) && (iVar1 = Gia_ObjIsAnd(pObj), iVar1 == 0)) {
    return (Gia_Obj_t *)0x0;
  }
  iVar1 = Gia_ObjIsAnd(pGVar2);
  if (iVar1 == 0) {
    local_60 = (Gia_Obj_t *)0x0;
  }
  else {
    local_60 = Gia_ObjChild0(pGVar2);
  }
  iVar1 = Gia_ObjIsAnd(pGVar2);
  if (iVar1 == 0) {
    local_68 = (Gia_Obj_t *)0x0;
  }
  else {
    local_68 = Gia_ObjChild1(pGVar2);
  }
  iVar1 = Gia_ObjIsAnd(pObj);
  if (iVar1 == 0) {
    local_70 = (Gia_Obj_t *)0x0;
  }
  else {
    local_70 = Gia_ObjChild0(pObj);
  }
  iVar1 = Gia_ObjIsAnd(pObj);
  if (iVar1 == 0) {
    local_78 = (Gia_Obj_t *)0x0;
  }
  else {
    local_78 = Gia_ObjChild1(pObj);
  }
  iVar1 = Gia_IsComplement(p0);
  if (iVar1 == 0) {
    pGVar2 = Gia_Not(p1);
    if ((local_60 == pGVar2) || (pGVar2 = Gia_Not(p1), local_68 == pGVar2)) {
      pGVar2 = Gia_ManConst0(p);
      return pGVar2;
    }
    if (local_60 == p1) {
      return p0;
    }
    if (local_68 == p1) {
      return p0;
    }
  }
  else {
    pGVar2 = Gia_Not(p1);
    if (local_60 == pGVar2) {
      return p1;
    }
    pGVar2 = Gia_Not(p1);
    if (local_68 == pGVar2) {
      return p1;
    }
    if (local_68 == p1) {
      pGVar2 = Gia_Not(local_60);
      pGVar2 = Gia_ManHashAndP(p,pGVar2,local_68);
      return pGVar2;
    }
    if (local_60 == p1) {
      pGVar2 = Gia_Not(local_68);
      pGVar2 = Gia_ManHashAndP(p,pGVar2,local_60);
      return pGVar2;
    }
  }
  iVar1 = Gia_IsComplement(p1);
  if (iVar1 == 0) {
    pGVar2 = Gia_Not(p0);
    if ((local_70 == pGVar2) || (pGVar2 = Gia_Not(p0), local_78 == pGVar2)) {
      pGVar2 = Gia_ManConst0(p);
      return pGVar2;
    }
    if (local_70 == p0) {
      return p1;
    }
    if (local_78 == p0) {
      return p1;
    }
  }
  else {
    pGVar2 = Gia_Not(p0);
    if (local_70 == pGVar2) {
      return p0;
    }
    pGVar2 = Gia_Not(p0);
    if (local_78 == pGVar2) {
      return p0;
    }
    if (local_78 == p0) {
      pGVar2 = Gia_Not(local_70);
      pGVar2 = Gia_ManHashAndP(p,pGVar2,local_78);
      return pGVar2;
    }
    if (local_70 == p0) {
      pGVar2 = Gia_Not(local_78);
      pGVar2 = Gia_ManHashAndP(p,pGVar2,local_70);
      return pGVar2;
    }
  }
  iVar1 = Gia_IsComplement(p0);
  if ((iVar1 == 0) && (iVar1 = Gia_IsComplement(p1), iVar1 == 0)) {
    pGVar2 = Gia_Not(local_70);
    if ((((local_60 == pGVar2) || (pGVar2 = Gia_Not(local_78), local_60 == pGVar2)) ||
        (pGVar2 = Gia_Not(local_70), local_68 == pGVar2)) ||
       (pGVar2 = Gia_Not(local_78), local_68 == pGVar2)) {
      pGVar2 = Gia_ManConst0(p);
      return pGVar2;
    }
    if ((local_60 == local_70) || (local_68 == local_70)) {
      pGVar2 = Gia_ManHashAndP(p,p0,local_78);
      return pGVar2;
    }
    if ((local_68 == local_70) || (local_68 == local_78)) {
      pGVar2 = Gia_ManHashAndP(p,local_60,p1);
      return pGVar2;
    }
    if ((local_60 == local_78) || (local_68 == local_78)) {
      pGVar2 = Gia_ManHashAndP(p,p0,local_70);
      return pGVar2;
    }
    if ((local_60 == local_70) || (local_60 == local_78)) {
      pGVar2 = Gia_ManHashAndP(p,local_68,p1);
      return pGVar2;
    }
  }
  else {
    iVar1 = Gia_IsComplement(p0);
    if ((iVar1 == 0) || (iVar1 = Gia_IsComplement(p1), iVar1 != 0)) {
      iVar1 = Gia_IsComplement(p0);
      if ((iVar1 == 0) && (iVar1 = Gia_IsComplement(p1), iVar1 != 0)) {
        pGVar2 = Gia_Not(local_60);
        if (local_70 == pGVar2) {
          return p0;
        }
        pGVar2 = Gia_Not(local_68);
        if (local_70 == pGVar2) {
          return p0;
        }
        pGVar2 = Gia_Not(local_60);
        if (local_78 == pGVar2) {
          return p0;
        }
        pGVar2 = Gia_Not(local_68);
        if (local_78 == pGVar2) {
          return p0;
        }
        if ((local_78 == local_60) || (local_78 == local_68)) {
          pGVar2 = Gia_Not(local_70);
          pGVar2 = Gia_ManHashAndP(p,pGVar2,p0);
          return pGVar2;
        }
        if ((local_70 == local_60) || (local_70 == local_68)) {
          pGVar2 = Gia_Not(local_78);
          pGVar2 = Gia_ManHashAndP(p,pGVar2,p0);
          return pGVar2;
        }
      }
      else {
        if ((local_60 == local_78) && (pGVar2 = Gia_Not(local_70), local_68 == pGVar2)) {
          pGVar2 = Gia_Not(local_60);
          return pGVar2;
        }
        if ((local_68 == local_70) && (pGVar2 = Gia_Not(local_78), local_60 == pGVar2)) {
          pGVar2 = Gia_Not(local_68);
          return pGVar2;
        }
        if ((local_60 == local_70) && (pGVar2 = Gia_Not(local_78), local_68 == pGVar2)) {
          pGVar2 = Gia_Not(local_60);
          return pGVar2;
        }
        if ((local_68 == local_78) && (pGVar2 = Gia_Not(local_70), local_60 == pGVar2)) {
          pGVar2 = Gia_Not(local_68);
          return pGVar2;
        }
      }
    }
    else {
      pGVar2 = Gia_Not(local_70);
      if (local_60 == pGVar2) {
        return p1;
      }
      pGVar2 = Gia_Not(local_78);
      if (local_60 == pGVar2) {
        return p1;
      }
      pGVar2 = Gia_Not(local_70);
      if (local_68 == pGVar2) {
        return p1;
      }
      pGVar2 = Gia_Not(local_78);
      if (local_68 == pGVar2) {
        return p1;
      }
      if ((local_68 == local_70) || (local_68 == local_78)) {
        pGVar2 = Gia_Not(local_60);
        pGVar2 = Gia_ManHashAndP(p,pGVar2,p1);
        return pGVar2;
      }
      if ((local_60 == local_70) || (local_60 == local_78)) {
        pGVar2 = Gia_Not(local_68);
        pGVar2 = Gia_ManHashAndP(p,pGVar2,p1);
        return pGVar2;
      }
    }
  }
  return (Gia_Obj_t *)0x0;
}

Assistant:

static inline Gia_Obj_t * Gia_ManAddStrash( Gia_Man_t * p, Gia_Obj_t * p0, Gia_Obj_t * p1 )  
{ 
    Gia_Obj_t * pNode0, * pNode1, * pFanA, * pFanB, * pFanC, * pFanD;
    assert( p->fAddStrash );
    pNode0 = Gia_Regular(p0);
    pNode1 = Gia_Regular(p1);
    if ( !Gia_ObjIsAnd(pNode0) && !Gia_ObjIsAnd(pNode1) )
        return NULL;
    pFanA = Gia_ObjIsAnd(pNode0) ? Gia_ObjChild0(pNode0) : NULL;
    pFanB = Gia_ObjIsAnd(pNode0) ? Gia_ObjChild1(pNode0) : NULL;
    pFanC = Gia_ObjIsAnd(pNode1) ? Gia_ObjChild0(pNode1) : NULL;
    pFanD = Gia_ObjIsAnd(pNode1) ? Gia_ObjChild1(pNode1) : NULL;
    if ( Gia_IsComplement(p0) )
    {
        if ( pFanA == Gia_Not(p1) || pFanB == Gia_Not(p1) )
            return p1;
        if ( pFanB == p1 )
            return Gia_ManHashAndP( p, Gia_Not(pFanA), pFanB );
        if ( pFanA == p1 )
            return Gia_ManHashAndP( p, Gia_Not(pFanB), pFanA );
    }
    else
    {
        if ( pFanA == Gia_Not(p1) || pFanB == Gia_Not(p1) )
            return Gia_ManConst0(p);
        if ( pFanA == p1 || pFanB == p1 )
            return p0;
    }
    if ( Gia_IsComplement(p1) )
    {
        if ( pFanC == Gia_Not(p0) || pFanD == Gia_Not(p0) )
            return p0;
        if ( pFanD == p0 )
            return Gia_ManHashAndP( p, Gia_Not(pFanC), pFanD );
        if ( pFanC == p0 )
            return Gia_ManHashAndP( p, Gia_Not(pFanD), pFanC );
    }
    else
    {
        if ( pFanC == Gia_Not(p0) || pFanD == Gia_Not(p0) )
            return Gia_ManConst0(p);
        if ( pFanC == p0 || pFanD == p0 )
            return p1;
    }
    if ( !Gia_IsComplement(p0) && !Gia_IsComplement(p1) ) 
    {
        if ( pFanA == Gia_Not(pFanC) || pFanA == Gia_Not(pFanD) || pFanB == Gia_Not(pFanC) || pFanB == Gia_Not(pFanD) )
            return Gia_ManConst0(p);
        if ( pFanA == pFanC || pFanB == pFanC )
            return Gia_ManHashAndP( p, p0, pFanD );
        if ( pFanB == pFanC || pFanB == pFanD )
            return Gia_ManHashAndP( p, pFanA, p1 );
        if ( pFanA == pFanD || pFanB == pFanD )
            return Gia_ManHashAndP( p, p0, pFanC );
        if ( pFanA == pFanC || pFanA == pFanD )
            return Gia_ManHashAndP( p, pFanB, p1 );
    }
    else if ( Gia_IsComplement(p0) && !Gia_IsComplement(p1) )
    {
        if ( pFanA == Gia_Not(pFanC) || pFanA == Gia_Not(pFanD) || pFanB == Gia_Not(pFanC) || pFanB == Gia_Not(pFanD) )
            return p1;
        if ( pFanB == pFanC || pFanB == pFanD )
            return Gia_ManHashAndP( p, Gia_Not(pFanA), p1 );
        if ( pFanA == pFanC || pFanA == pFanD )
            return Gia_ManHashAndP( p, Gia_Not(pFanB), p1 );
    }
    else if ( !Gia_IsComplement(p0) && Gia_IsComplement(p1) )
    {
        if ( pFanC == Gia_Not(pFanA) || pFanC == Gia_Not(pFanB) || pFanD == Gia_Not(pFanA) || pFanD == Gia_Not(pFanB) )
            return p0;
        if ( pFanD == pFanA || pFanD == pFanB )
            return Gia_ManHashAndP( p, Gia_Not(pFanC), p0 );
        if ( pFanC == pFanA || pFanC == pFanB )
            return Gia_ManHashAndP( p, Gia_Not(pFanD), p0 );
    }
    else // if ( Gia_IsComplement(p0) && Gia_IsComplement(p1) )
    {
        if ( pFanA == pFanD && pFanB == Gia_Not(pFanC) )
            return Gia_Not(pFanA);
        if ( pFanB == pFanC && pFanA == Gia_Not(pFanD) )
            return Gia_Not(pFanB);
        if ( pFanA == pFanC && pFanB == Gia_Not(pFanD) )
            return Gia_Not(pFanA);
        if ( pFanB == pFanD && pFanA == Gia_Not(pFanC) )
            return Gia_Not(pFanB);
    }
/*
    if ( !Gia_IsComplement(p0) || !Gia_IsComplement(p1) )
        return NULL;
    if ( !Gia_ObjIsAnd(pNode0) || !Gia_ObjIsAnd(pNode1) )
        return NULL;
    if ( (Gia_ObjFanin0(pNode0) == Gia_ObjFanin0(pNode1) && (Gia_ObjFaninC0(pNode0) ^ Gia_ObjFaninC0(pNode1))) || 
         (Gia_ObjFanin0(pNode0) == Gia_ObjFanin1(pNode1) && (Gia_ObjFaninC0(pNode0) ^ Gia_ObjFaninC1(pNode1))) ||
         (Gia_ObjFanin1(pNode0) == Gia_ObjFanin0(pNode1) && (Gia_ObjFaninC1(pNode0) ^ Gia_ObjFaninC0(pNode1))) ||
         (Gia_ObjFanin1(pNode0) == Gia_ObjFanin1(pNode1) && (Gia_ObjFaninC1(pNode0) ^ Gia_ObjFaninC1(pNode1))) )
    {
        Gia_Obj_t * pNodeC, * pNodeT, * pNodeE;
        int fCompl;
        pNodeC = Gia_ObjRecognizeMuxTwo( pNode0, pNode1, &pNodeT, &pNodeE );
        // using non-standard canonical rule for MUX (d0 is not compl; d1 may be compl)
        if ( (fCompl = Gia_IsComplement(pNodeE)) )
        {
            pNodeE = Gia_Not(pNodeE);
            pNodeT = Gia_Not(pNodeT);
        }
        pNode0 = Gia_ManHashAndP( p, Gia_Not(pNodeC), pNodeE );
        pNode1 = Gia_ManHashAndP( p, pNodeC,          pNodeT );
        p->fAddStrash = 0;
        pNodeC = Gia_NotCond( Gia_ManHashAndP( p, Gia_Not(pNode0), Gia_Not(pNode1) ), !fCompl );
        p->fAddStrash = 1;
        return pNodeC;
    }
*/
    return NULL;
}